

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_chart_begin_colored
              (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
              float min_value,float max_value)

{
  float fVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  nk_rect r;
  nk_rect r_00;
  nk_widget_layout_states nVar4;
  int iVar5;
  nk_chart *ptr;
  nk_style_chart *pnVar6;
  nk_chart_slot *pnVar7;
  nk_rect nVar8;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  nk_chart_slot *slot;
  nk_rect bounds;
  nk_style_item *background;
  nk_style_chart *style;
  nk_style *config;
  nk_chart *chart;
  nk_window *win;
  float max_value_local;
  float min_value_local;
  int count_local;
  nk_chart_type type_local;
  nk_context *ctx_local;
  nk_color highlight_local;
  nk_color color_local;
  
  memset(&slot,0,0x10);
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5dec,
                  "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5ded,
                  "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5dee,
                  "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
     (ctx->current->layout == (nk_panel *)0x0)) {
    highlight_local.r = '\0';
    highlight_local.g = '\0';
    highlight_local.b = '\0';
    highlight_local.a = '\0';
  }
  else {
    nVar4 = nk_widget((nk_rect *)&slot,ctx);
    if (nVar4 == NK_WIDGET_INVALID) {
      nk_zero(&ctx->current->layout->chart,0xb4);
      highlight_local.r = '\0';
      highlight_local.g = '\0';
      highlight_local.b = '\0';
      highlight_local.a = '\0';
    }
    else {
      pnVar2 = ctx->current;
      pnVar3 = pnVar2->layout;
      ptr = &pnVar3->chart;
      pnVar6 = &(ctx->style).chart;
      nk_zero(ptr,0xb4);
      (pnVar3->chart).x = slot._0_4_ + (ctx->style).chart.padding.x;
      (pnVar3->chart).y = slot._4_4_ + (ctx->style).chart.padding.y;
      fVar1 = (ctx->style).chart.padding.x;
      (pnVar3->chart).w = bounds.x - (fVar1 + fVar1);
      fVar1 = (ctx->style).chart.padding.y;
      (pnVar3->chart).h = bounds.y - (fVar1 + fVar1);
      if ((ctx->style).chart.padding.x * 2.0 <= (pnVar3->chart).w) {
        local_84 = (pnVar3->chart).w;
      }
      else {
        local_84 = (ctx->style).chart.padding.x * 2.0;
      }
      (pnVar3->chart).w = local_84;
      if ((ctx->style).chart.padding.y * 2.0 <= (pnVar3->chart).h) {
        local_88 = (pnVar3->chart).h;
      }
      else {
        local_88 = (ctx->style).chart.padding.y * 2.0;
      }
      (pnVar3->chart).h = local_88;
      iVar5 = ptr->slot;
      ptr->slot = iVar5 + 1;
      pnVar7 = (pnVar3->chart).slots + iVar5;
      pnVar7->type = type;
      pnVar7->count = count;
      pnVar7->color = color;
      pnVar7->highlight = highlight;
      local_8c = max_value;
      if (min_value < max_value) {
        local_8c = min_value;
      }
      pnVar7->min = local_8c;
      local_90 = min_value;
      if (min_value < max_value) {
        local_90 = max_value;
      }
      pnVar7->max = local_90;
      pnVar7->range = pnVar7->max - pnVar7->min;
      bounds._8_8_ = pnVar6;
      if ((pnVar6->background).type == NK_STYLE_ITEM_IMAGE) {
        r.y = slot._4_4_;
        r.x = slot._0_4_;
        r.w = bounds.x;
        r.h = bounds.y;
        nk_draw_image(&pnVar2->buffer,r,&(ctx->style).chart.background.data.image,
                      (nk_color)0xffffffff);
      }
      else {
        nVar8.y = slot._4_4_;
        nVar8.x = slot._0_4_;
        nVar8.w = bounds.x;
        nVar8.h = bounds.y;
        nk_fill_rect(&pnVar2->buffer,nVar8,(ctx->style).chart.rounding,
                     (ctx->style).chart.border_color);
        r_00.y = slot._4_4_;
        r_00.x = slot._0_4_;
        r_00.w = bounds.x;
        r_00.h = bounds.y;
        nVar8 = nk_shrink_rect(r_00,(ctx->style).chart.border);
        nk_fill_rect(&pnVar2->buffer,nVar8,(ctx->style).chart.rounding,
                     (ctx->style).chart.background.data.color);
      }
      highlight_local.r = '\x01';
      highlight_local.g = '\0';
      highlight_local.b = '\0';
      highlight_local.a = '\0';
    }
  }
  iVar5._0_1_ = highlight_local.r;
  iVar5._1_1_ = highlight_local.g;
  iVar5._2_1_ = highlight_local.b;
  iVar5._3_1_ = highlight_local.a;
  return iVar5;
}

Assistant:

NK_API int
nk_chart_begin_colored(struct nk_context *ctx, enum nk_chart_type type,
    struct nk_color color, struct nk_color highlight,
    int count, float min_value, float max_value)
{
    struct nk_window *win;
    struct nk_chart *chart;
    const struct nk_style *config;
    const struct nk_style_chart *style;

    const struct nk_style_item *background;
    struct nk_rect bounds = {0, 0, 0, 0};

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);

    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    if (!nk_widget(&bounds, ctx)) {
        chart = &ctx->current->layout->chart;
        nk_zero(chart, sizeof(*chart));
        return 0;
    }

    win = ctx->current;
    config = &ctx->style;
    chart = &win->layout->chart;
    style = &config->chart;

    /* setup basic generic chart  */
    nk_zero(chart, sizeof(*chart));
    chart->x = bounds.x + style->padding.x;
    chart->y = bounds.y + style->padding.y;
    chart->w = bounds.w - 2 * style->padding.x;
    chart->h = bounds.h - 2 * style->padding.y;
    chart->w = NK_MAX(chart->w, 2 * style->padding.x);
    chart->h = NK_MAX(chart->h, 2 * style->padding.y);

    /* add first slot into chart */
    {struct nk_chart_slot *slot = &chart->slots[chart->slot++];
    slot->type = type;
    slot->count = count;
    slot->color = color;
    slot->highlight = highlight;
    slot->min = NK_MIN(min_value, max_value);
    slot->max = NK_MAX(min_value, max_value);
    slot->range = slot->max - slot->min;}

    /* draw chart background */
    background = &style->background;
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(&win->buffer, bounds, &background->data.image, nk_white);
    } else {
        nk_fill_rect(&win->buffer, bounds, style->rounding, style->border_color);
        nk_fill_rect(&win->buffer, nk_shrink_rect(bounds, style->border),
            style->rounding, style->background.data.color);
    }
    return 1;
}